

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-dtoa.cc
# Opt level: O2

bool __thiscall
double_conversion::FastDtoa
          (double_conversion *this,double v,FastDtoaMode mode,int requested_digits,
          Vector<char> buffer,int *length,int *decimal_point)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  byte bVar4;
  int length_00;
  undefined4 in_register_00000014;
  uint64_t uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint64_t unsafe_interval;
  ulong uVar9;
  ulong uVar10;
  uint64_t uVar11;
  ulong uVar12;
  DiyFp DVar13;
  DiyFp DVar14;
  DiyFp DVar15;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  int *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  int mk;
  uint local_ac;
  uint64_t local_a8;
  int *local_a0;
  uint *local_98;
  char *local_90;
  DiyFp boundary_plus;
  DiyFp boundary_minus;
  DiyFp ten_mk;
  DiyFp local_40;
  
  local_90 = (char *)CONCAT44(in_register_00000014,requested_digits);
  local_98 = buffer._8_8_;
  uVar8 = (uint)this;
  local_a0 = length;
  boundary_minus.f_ = (uint64_t)v;
  if (uVar8 < 2) {
    DVar13 = Double::AsNormalizedDiyFp((Double *)&boundary_minus);
    local_40.f_ = DVar13.f_;
    iVar7 = DVar13.e_;
    boundary_minus.f_ = 0;
    boundary_minus.e_ = 0;
    boundary_plus.f_ = 0;
    boundary_plus.e_ = 0;
    local_40.e_ = iVar7;
    if (uVar8 == 0) {
      ten_mk.f_ = (uint64_t)v;
      Double::NormalizedBoundaries((Double *)&ten_mk,&boundary_minus,&boundary_plus);
    }
    else {
      ten_mk.f_ = CONCAT44(ten_mk.f_._4_4_,(float)v);
      Single::NormalizedBoundaries((Single *)&ten_mk,&boundary_minus,&boundary_plus);
    }
    ten_mk.f_ = 0;
    ten_mk.e_ = 0;
    PowersOfTenCache::GetCachedPowerForBinaryExponentRange
              (-0x7c - iVar7,-0x60 - iVar7,&ten_mk,(int *)&local_ac);
    DVar13 = DiyFp::Times(&local_40,&ten_mk);
    DVar14 = DiyFp::Times(&boundary_minus,&ten_mk);
    DVar15 = DiyFp::Times(&boundary_plus,&ten_mk);
    local_a8 = DVar15.f_ + 1;
    uVar9 = (DVar15.f_ - DVar14.f_) + 2;
    bVar4 = -(char)DVar13.e_;
    uVar11 = 1;
    uVar5 = 1L << (bVar4 & 0x3f);
    uVar10 = local_a8 >> (bVar4 & 0x3f);
    uVar1 = uVar5 - 1;
    uVar12 = uVar1 & local_a8;
    BiggestPowerTen((uint32_t)uVar10,DVar13.e_ + 0x40,(uint32_t *)&mk,
                    (int *)&stack0xffffffffffffff44);
    *local_98 = 0;
    uVar6 = (int)in_stack_ffffffffffffff44 >> 0x1f & in_stack_ffffffffffffff44;
    buffer_00.length_ = 0;
    uVar8 = in_stack_ffffffffffffff44;
    while( true ) {
      if ((int)uVar8 < 1) break;
      uVar3 = uVar10 & 0xffffffff;
      uVar10 = uVar3 % (ulong)(uint)mk;
      local_90[(int)buffer_00.length_] = (char)(uVar3 / (uint)mk) + '0';
      buffer_01.length_ = *local_98 + 1;
      *local_98 = buffer_01.length_;
      unsafe_interval = (uVar10 << (bVar4 & 0x3f)) + uVar12;
      if (unsafe_interval < uVar9) {
        buffer_01.start_ = local_90;
        buffer_01._12_4_ = 0;
        bVar2 = RoundWeed(buffer_01,(int)local_a8 - (int)DVar13.f_,uVar9,unsafe_interval,
                          (ulong)(uint)mk << (bVar4 & 0x3f),1,
                          CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        if (!bVar2) {
          return false;
        }
        iVar7 = ~local_ac + uVar8;
        goto LAB_00852b91;
      }
      mk = (uint)mk / 10;
      uVar8 = uVar8 - 1;
      buffer_00.length_ = buffer_01.length_;
    }
    do {
      uVar11 = uVar11 * 10;
      uVar9 = uVar9 * 10;
      local_90[(int)buffer_00.length_] = (char)(uVar12 * 10 >> (bVar4 & 0x3f)) + '0';
      buffer_00.length_ = *local_98 + 1;
      *local_98 = buffer_00.length_;
      uVar12 = uVar12 * 10 & uVar1;
      uVar6 = uVar6 - 1;
    } while (uVar9 <= uVar12);
    buffer_00.start_ = local_90;
    buffer_00._12_4_ = 0;
    bVar2 = RoundWeed(buffer_00,((int)local_a8 - (int)DVar13.f_) * (int)uVar11,uVar9,uVar12,uVar5,
                      uVar11,CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    if (!bVar2) {
      return false;
    }
    iVar7 = uVar6 - local_ac;
  }
  else {
    if (uVar8 != 2) {
      abort();
    }
    DVar13 = Double::AsNormalizedDiyFp((Double *)&boundary_minus);
    local_40.f_ = DVar13.f_;
    boundary_minus.f_ = 0;
    local_40.e_ = DVar13.e_;
    boundary_minus.e_ = 0;
    PowersOfTenCache::GetCachedPowerForBinaryExponentRange
              (-0x7c - local_40.e_,-0x60 - local_40.e_,&boundary_minus,&mk);
    DVar13 = DiyFp::Times(&local_40,&boundary_minus);
    bVar4 = -(char)DVar13.e_;
    uVar11 = 1;
    local_a8 = 1L << (bVar4 & 0x3f);
    uVar1 = local_a8 - 1;
    uVar12 = uVar1 & DVar13.f_;
    uVar10 = DVar13.f_ >> (bVar4 & 0x3f);
    BiggestPowerTen((uint32_t)uVar10,DVar13.e_ + 0x40,(uint32_t *)&boundary_plus,(int *)&ten_mk);
    *local_98 = 0;
    uVar9 = 0;
    for (; 0 < (int)ten_mk.f_; ten_mk.f_._0_4_ = (int)ten_mk.f_ + -1) {
      uVar3 = uVar10 & 0xffffffff;
      uVar10 = uVar3 % (ulong)(uint)boundary_plus.f_;
      local_90[(int)uVar9] = (char)(uVar3 / (uint)boundary_plus.f_) + '0';
      uVar9 = (ulong)(*local_98 + 1);
      *local_98 = *local_98 + 1;
      if (mode == FAST_DTOA_SHORTEST_SINGLE) {
        ten_mk.f_._0_4_ = (int)ten_mk.f_ + -1;
        goto LAB_00852b60;
      }
      boundary_plus.f_._0_4_ = (uint)boundary_plus.f_ / 10;
      mode = mode - FAST_DTOA_SHORTEST_SINGLE;
    }
    if (mode == FAST_DTOA_SHORTEST) {
LAB_00852b60:
      length_00 = (int)((uVar10 & 0xffffffff) << (bVar4 & 0x3f)) + (int)uVar12;
      uVar11 = 1;
      uVar5 = (ulong)(uint)boundary_plus.f_ << (bVar4 & 0x3f);
      iVar7 = (int)ten_mk.f_;
    }
    else {
      for (; (0 < (int)mode && (uVar11 < uVar12)); uVar11 = uVar11 * 10) {
        local_90[(int)uVar9] = (char)(uVar12 * 10 >> (bVar4 & 0x3f)) + '0';
        uVar9 = (ulong)(*local_98 + 1);
        *local_98 = *local_98 + 1;
        mode = mode - FAST_DTOA_SHORTEST_SINGLE;
        uVar12 = uVar12 * 10 & uVar1;
        ten_mk.f_._0_4_ = (int)ten_mk.f_ + -1;
      }
      if (mode != FAST_DTOA_SHORTEST) {
        return false;
      }
      length_00 = (int)uVar12;
      uVar5 = local_a8;
      iVar7 = (int)ten_mk.f_;
    }
    buffer_02._8_8_ = uVar9;
    buffer_02.start_ = local_90;
    bVar2 = RoundWeedCounted(buffer_02,length_00,uVar5,uVar11,(uint64_t)&stack0xffffffffffffff44,
                             in_stack_ffffffffffffff38);
    if (!bVar2) {
      return false;
    }
    iVar7 = iVar7 - mk;
  }
LAB_00852b91:
  *local_a0 = iVar7 + *local_98;
  local_90[(int)*local_98] = '\0';
  return true;
}

Assistant:

bool FastDtoa(double v,
              FastDtoaMode mode,
              int requested_digits,
              Vector<char> buffer,
              int* length,
              int* decimal_point) {
  DOUBLE_CONVERSION_ASSERT(v > 0);
  DOUBLE_CONVERSION_ASSERT(!Double(v).IsSpecial());

  bool result = false;
  int decimal_exponent = 0;
  switch (mode) {
    case FAST_DTOA_SHORTEST:
    case FAST_DTOA_SHORTEST_SINGLE:
      result = Grisu3(v, mode, buffer, length, &decimal_exponent);
      break;
    case FAST_DTOA_PRECISION:
      result = Grisu3Counted(v, requested_digits,
                             buffer, length, &decimal_exponent);
      break;
    default:
      DOUBLE_CONVERSION_UNREACHABLE();
  }
  if (result) {
    *decimal_point = *length + decimal_exponent;
    buffer[*length] = '\0';
  }
  return result;
}